

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O1

String * __thiscall
kj::_::anon_unknown_2::makeDescriptionImpl
          (String *__return_storage_ptr__,anon_unknown_2 *this,DescriptionStyle style,char *code,
          int errorNumber,char *sysErrorString,char *macroArgs,ArrayPtr<kj::String> argValues)

{
  char cVar1;
  void *__src;
  int iVar2;
  ExceptionCallback *pEVar3;
  size_t sVar4;
  long *plVar5;
  undefined4 in_register_00000014;
  long *plVar6;
  size_t *psVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  int iVar11;
  size_t sVar12;
  long lVar13;
  String *pSVar14;
  undefined4 in_register_00000084;
  size_t sVar15;
  char *pcVar16;
  char *pcVar17;
  bool bVar18;
  long lVar19;
  void *pvVar20;
  Array<kj::ArrayPtr<const_char>_> argNames_heap;
  ArrayPtr<const_char> argNames_stack [8];
  char buffer [256];
  undefined7 in_stack_fffffffffffffdf8;
  char *local_200;
  long local_1f8;
  char *local_1e8;
  String *pSStack_1e0;
  undefined8 *local_1d8;
  long local_1c8;
  String *local_1c0;
  char local_1b8 [128];
  String local_138 [11];
  
  local_1c8 = CONCAT44(in_register_00000084,errorNumber);
  pcVar16 = (char *)CONCAT44(in_register_00000014,style);
  iVar11 = (int)this;
  local_1b8[0x70] = '\0';
  local_1b8[0x71] = '\0';
  local_1b8[0x72] = '\0';
  local_1b8[0x73] = '\0';
  local_1b8[0x74] = '\0';
  local_1b8[0x75] = '\0';
  local_1b8[0x76] = '\0';
  local_1b8[0x77] = '\0';
  local_1b8[0x78] = '\0';
  local_1b8[0x79] = '\0';
  local_1b8[0x7a] = '\0';
  local_1b8[0x7b] = '\0';
  local_1b8[0x7c] = '\0';
  local_1b8[0x7d] = '\0';
  local_1b8[0x7e] = '\0';
  local_1b8[0x7f] = '\0';
  local_1b8[0x60] = '\0';
  local_1b8[0x61] = '\0';
  local_1b8[0x62] = '\0';
  local_1b8[99] = '\0';
  local_1b8[100] = '\0';
  local_1b8[0x65] = '\0';
  local_1b8[0x66] = '\0';
  local_1b8[0x67] = '\0';
  local_1b8[0x68] = '\0';
  local_1b8[0x69] = '\0';
  local_1b8[0x6a] = '\0';
  local_1b8[0x6b] = '\0';
  local_1b8[0x6c] = '\0';
  local_1b8[0x6d] = '\0';
  local_1b8[0x6e] = '\0';
  local_1b8[0x6f] = '\0';
  local_1b8[0x50] = '\0';
  local_1b8[0x51] = '\0';
  local_1b8[0x52] = '\0';
  local_1b8[0x53] = '\0';
  local_1b8[0x54] = '\0';
  local_1b8[0x55] = '\0';
  local_1b8[0x56] = '\0';
  local_1b8[0x57] = '\0';
  local_1b8[0x58] = '\0';
  local_1b8[0x59] = '\0';
  local_1b8[0x5a] = '\0';
  local_1b8[0x5b] = '\0';
  local_1b8[0x5c] = '\0';
  local_1b8[0x5d] = '\0';
  local_1b8[0x5e] = '\0';
  local_1b8[0x5f] = '\0';
  local_1b8[0x40] = '\0';
  local_1b8[0x41] = '\0';
  local_1b8[0x42] = '\0';
  local_1b8[0x43] = '\0';
  local_1b8[0x44] = '\0';
  local_1b8[0x45] = '\0';
  local_1b8[0x46] = '\0';
  local_1b8[0x47] = '\0';
  local_1b8[0x48] = '\0';
  local_1b8[0x49] = '\0';
  local_1b8[0x4a] = '\0';
  local_1b8[0x4b] = '\0';
  local_1b8[0x4c] = '\0';
  local_1b8[0x4d] = '\0';
  local_1b8[0x4e] = '\0';
  local_1b8[0x4f] = '\0';
  local_1b8[0x30] = '\0';
  local_1b8[0x31] = '\0';
  local_1b8[0x32] = '\0';
  local_1b8[0x33] = '\0';
  local_1b8[0x34] = '\0';
  local_1b8[0x35] = '\0';
  local_1b8[0x36] = '\0';
  local_1b8[0x37] = '\0';
  local_1b8[0x38] = '\0';
  local_1b8[0x39] = '\0';
  local_1b8[0x3a] = '\0';
  local_1b8[0x3b] = '\0';
  local_1b8[0x3c] = '\0';
  local_1b8[0x3d] = '\0';
  local_1b8[0x3e] = '\0';
  local_1b8[0x3f] = '\0';
  local_1b8[0x20] = '\0';
  local_1b8[0x21] = '\0';
  local_1b8[0x22] = '\0';
  local_1b8[0x23] = '\0';
  local_1b8[0x24] = '\0';
  local_1b8[0x25] = '\0';
  local_1b8[0x26] = '\0';
  local_1b8[0x27] = '\0';
  local_1b8[0x28] = '\0';
  local_1b8[0x29] = '\0';
  local_1b8[0x2a] = '\0';
  local_1b8[0x2b] = '\0';
  local_1b8[0x2c] = '\0';
  local_1b8[0x2d] = '\0';
  local_1b8[0x2e] = '\0';
  local_1b8[0x2f] = '\0';
  local_1b8[0x10] = '\0';
  local_1b8[0x11] = '\0';
  local_1b8[0x12] = '\0';
  local_1b8[0x13] = '\0';
  local_1b8[0x14] = '\0';
  local_1b8[0x15] = '\0';
  local_1b8[0x16] = '\0';
  local_1b8[0x17] = '\0';
  local_1b8[0x18] = '\0';
  local_1b8[0x19] = '\0';
  local_1b8[0x1a] = '\0';
  local_1b8[0x1b] = '\0';
  local_1b8[0x1c] = '\0';
  local_1b8[0x1d] = '\0';
  local_1b8[0x1e] = '\0';
  local_1b8[0x1f] = '\0';
  local_1b8[0] = '\0';
  local_1b8[1] = '\0';
  local_1b8[2] = '\0';
  local_1b8[3] = '\0';
  local_1b8[4] = '\0';
  local_1b8[5] = '\0';
  local_1b8[6] = '\0';
  local_1b8[7] = '\0';
  local_1b8[8] = '\0';
  local_1b8[9] = '\0';
  local_1b8[10] = '\0';
  local_1b8[0xb] = '\0';
  local_1b8[0xc] = '\0';
  local_1b8[0xd] = '\0';
  local_1b8[0xe] = '\0';
  local_1b8[0xf] = '\0';
  if ((String *)&DAT_00000008 < argValues.ptr) {
    pcVar17 = (char *)HeapArrayDisposer::allocateImpl
                                (0x10,(size_t)argValues.ptr,(size_t)argValues.ptr,
                                 HeapArrayDisposer::
                                 Allocate_<kj::ArrayPtr<const_char>,_false,_false>::construct,
                                 HeapArrayDisposer::
                                 Allocate_<kj::ArrayPtr<const_char>,_false,_false>::destruct);
    pSStack_1e0 = argValues.ptr;
    local_1d8 = &HeapArrayDisposer::instance;
    local_1e8 = pcVar17;
  }
  else {
    local_1e8 = (char *)0x0;
    pSStack_1e0 = (String *)0x0;
    local_1d8 = (undefined8 *)0x0;
    pcVar17 = local_1b8;
  }
  if (argValues.ptr != (String *)0x0) {
    pcVar8 = (char *)(local_1c8 + -1);
    do {
      pcVar9 = pcVar8 + 1;
      pcVar8 = pcVar8 + 1;
      iVar2 = isspace((int)*pcVar9);
    } while (iVar2 != 0);
    iVar2 = 0;
    bVar18 = false;
    pSVar14 = (String *)0x0;
    pcVar9 = pcVar8;
    do {
      pcVar10 = pcVar9 + 1;
      cVar1 = *pcVar9;
      if (cVar1 != '\0') {
        if (bVar18) {
          if (cVar1 == '\"') {
            bVar18 = false;
          }
          else if ((cVar1 == '\\') && (*pcVar10 != '\0')) {
            pcVar10 = pcVar9 + 2;
          }
        }
        else if (cVar1 == '\"') {
          bVar18 = true;
        }
        else if (cVar1 == ')') {
          iVar2 = iVar2 + -1;
        }
        else if (cVar1 == '(') {
          iVar2 = iVar2 + 1;
        }
        else if (cVar1 == ',' && iVar2 == 0) {
          if (pSVar14 < argValues.ptr) {
            *(char **)(pcVar17 + (long)pSVar14 * 0x10) = pcVar8;
            *(long *)(pcVar17 + ((long)pSVar14 * 2 + 1) * 8) = (long)pcVar9 - (long)pcVar8;
          }
          do {
            pcVar8 = pcVar9 + 1;
            iVar2 = isspace((int)pcVar9[1]);
            pcVar9 = pcVar8;
          } while (iVar2 != 0);
          pSVar14 = (String *)((long)&(pSVar14->content).ptr + 1);
          iVar2 = 0;
          pcVar10 = pcVar8;
        }
      }
      pcVar9 = pcVar10;
    } while (cVar1 != '\0');
    if (pSVar14 < argValues.ptr) {
      *(char **)(pcVar17 + (long)pSVar14 * 0x10) = pcVar8;
      *(char **)(pcVar17 + ((long)pSVar14 * 2 + 1) * 8) = pcVar10 + ~(ulong)pcVar8;
    }
    if ((String *)((long)&(pSVar14->content).ptr + 1) != argValues.ptr) {
      pEVar3 = getExceptionCallback();
      local_1c0 = argValues.ptr;
      str<char_const(&)[41],unsigned_long,char_const(&)[9],char_const*&,char>
                (local_138,(kj *)"Failed to parse logging macro args into ",
                 (char (*) [41])&local_1c0,(unsigned_long *)" names: ",(char (*) [9])&local_1c8,
                 (char **)&stack0xfffffffffffffdff,(char *)CONCAT17(10,in_stack_fffffffffffffdf8));
      (*pEVar3->_vptr_ExceptionCallback[4])
                (pEVar3,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug.c++"
                 ,0xd9,0,local_138);
      sVar12 = local_138[0].content.size_;
      pcVar8 = local_138[0].content.ptr;
      if (local_138[0].content.ptr != (char *)0x0) {
        local_138[0].content.ptr = (char *)0x0;
        local_138[0].content.size_ = 0;
        (**(local_138[0].content.disposer)->_vptr_ArrayDisposer)
                  (local_138[0].content.disposer,pcVar8,1,sVar12,sVar12,0);
      }
    }
  }
  if (((iVar11 == 2) && (pcVar8 = strchr(pcVar16,0x3d), pcVar8 != (char *)0x0)) &&
     (pcVar8[1] != '=')) {
    do {
      pcVar16 = pcVar8 + 1;
      iVar2 = isspace((int)pcVar8[1]);
      pcVar8 = pcVar16;
    } while (iVar2 != 0);
  }
  iVar2 = 0;
  if (pcVar16 != (char *)0x0) {
    iVar2 = iVar11;
  }
  if (iVar11 != 1) {
    iVar2 = iVar11;
  }
  local_1f8 = 1;
  pcVar8 = "";
  local_200 = "";
  lVar19 = 1;
  if (iVar2 != 0) {
    sVar4 = strlen(pcVar16);
    lVar19 = sVar4 + 1;
    local_200 = pcVar16;
  }
  if (iVar2 == 1) {
    sVar12 = lVar19 + 8;
  }
  else if (iVar2 == 2) {
    pcVar8 = strerror_r((int)code,(char *)local_138,0x100);
    sVar4 = strlen(pcVar8);
    sVar12 = sVar4 + lVar19 + 1;
    local_1f8 = sVar4 + 1;
  }
  else {
    sVar12 = 0;
  }
  if (argValues.ptr != (String *)0x0) {
    plVar6 = (long *)(pcVar17 + 8);
    plVar5 = (long *)(macroArgs + 8);
    pSVar14 = (String *)0x0;
    do {
      sVar15 = sVar12;
      if (pSVar14 != (String *)0x0) {
        sVar15 = sVar12 + 2;
      }
      if (iVar2 != 0) {
        sVar15 = sVar12 + 2;
      }
      if ((*plVar6 != 0) && (*(char *)plVar6[-1] != '\"')) {
        sVar15 = sVar15 + *plVar6 + 3;
      }
      lVar13 = 0;
      if (*plVar5 != 0) {
        lVar13 = *plVar5 + -1;
      }
      sVar12 = lVar13 + sVar15;
      pSVar14 = (String *)((long)&(pSVar14->content).ptr + 1);
      plVar6 = plVar6 + 2;
      plVar5 = plVar5 + 3;
    } while (argValues.ptr != pSVar14);
  }
  heapString(__return_storage_ptr__,sVar12);
  pcVar16 = (char *)(__return_storage_ptr__->content).size_;
  if (pcVar16 != (char *)0x0) {
    pcVar16 = (__return_storage_ptr__->content).ptr;
  }
  if (iVar2 == 2) {
    if (local_200 != local_200 + lVar19 + -1) {
      memcpy(pcVar16,local_200,lVar19 - 1);
      pcVar16 = pcVar16 + lVar19 + -1;
    }
    pcVar16[0] = ':';
    pcVar16[1] = ' ';
    pcVar16 = pcVar16 + 2;
    if (pcVar8 != pcVar8 + local_1f8 + -1) {
      memcpy(pcVar16,pcVar8,local_1f8 - 1);
      pcVar16 = pcVar16 + local_1f8 + -1;
    }
  }
  else if (iVar2 == 1) {
    builtin_strncpy(pcVar16,"expected ",9);
    pcVar16 = pcVar16 + 9;
    if (local_200 != local_200 + lVar19 + -1) {
      memcpy(pcVar16,local_200,lVar19 - 1);
      pcVar16 = pcVar16 + lVar19 + -1;
    }
  }
  if (argValues.ptr != (String *)0x0) {
    psVar7 = (size_t *)(pcVar17 + 8);
    lVar19 = 8;
    pSVar14 = (String *)0x0;
    do {
      if (iVar2 != 0 || pSVar14 != (String *)0x0) {
        pcVar16[0] = ';';
        pcVar16[1] = ' ';
        pcVar16 = pcVar16 + 2;
      }
      sVar4 = *psVar7;
      if ((sVar4 != 0) && (*(char *)psVar7[-1] != '\"')) {
        memcpy(pcVar16,(char *)psVar7[-1],sVar4);
        pcVar17 = pcVar16 + sVar4;
        pcVar16 = pcVar17 + 3;
        pcVar17[0] = ' ';
        pcVar17[1] = '=';
        pcVar17[2] = ' ';
      }
      __src = *(void **)(macroArgs + lVar19 + -8);
      pvVar20 = (void *)((long)__src + *(long *)(macroArgs + lVar19) + -1);
      if (*(long *)(macroArgs + lVar19) == 0) {
        pvVar20 = (void *)0x0;
        __src = (void *)0x0;
      }
      if (__src != pvVar20) {
        memcpy(pcVar16,__src,(long)pvVar20 - (long)__src);
        pcVar16 = pcVar16 + ((long)pvVar20 - (long)__src);
      }
      pSVar14 = (String *)((long)&(pSVar14->content).ptr + 1);
      psVar7 = psVar7 + 2;
      lVar19 = lVar19 + 0x18;
    } while (pSVar14 < argValues.ptr);
  }
  if (local_1e8 != (char *)0x0) {
    (**(code **)*local_1d8)(local_1d8,local_1e8,0x10,pSStack_1e0,pSStack_1e0,0);
  }
  return __return_storage_ptr__;
}

Assistant:

static String makeDescriptionImpl(DescriptionStyle style, const char* code, int errorNumber,
                                  const char* sysErrorString, const char* macroArgs,
                                  ArrayPtr<String> argValues) {
  KJ_STACK_ARRAY(ArrayPtr<const char>, argNames, argValues.size(), 8, 64);

  if (argValues.size() > 0) {
    size_t index = 0;
    const char* start = macroArgs;
    while (isspace(*start)) ++start;
    const char* pos = start;
    uint depth = 0;
    bool quoted = false;
    while (char c = *pos++) {
      if (quoted) {
        if (c == '\\' && *pos != '\0') {
          ++pos;
        } else if (c == '\"') {
          quoted = false;
        }
      } else {
        if (c == '(') {
          ++depth;
        } else if (c == ')') {
          --depth;
        } else if (c == '\"') {
          quoted = true;
        } else if (c == ',' && depth == 0) {
          if (index < argValues.size()) {
            argNames[index] = arrayPtr(start, pos - 1);
          }
          ++index;
          while (isspace(*pos)) ++pos;
          start = pos;
        }
      }
    }
    if (index < argValues.size()) {
      argNames[index] = arrayPtr(start, pos - 1);
    }
    ++index;

    if (index != argValues.size()) {
      getExceptionCallback().logMessage(LogSeverity::ERROR, __FILE__, __LINE__, 0,
          str("Failed to parse logging macro args into ",
              argValues.size(), " names: ", macroArgs, '\n'));
    }
  }

  if (style == SYSCALL) {
    // Strip off leading "foo = " from code, since callers will sometimes write things like:
    //   ssize_t n;
    //   RECOVERABLE_SYSCALL(n = read(fd, buffer, sizeof(buffer))) { return ""; }
    //   return std::string(buffer, n);
    const char* equalsPos = strchr(code, '=');
    if (equalsPos != nullptr && equalsPos[1] != '=') {
      code = equalsPos + 1;
      while (isspace(*code)) ++code;
    }
  }

  if (style == ASSERTION && code == nullptr) {
    style = LOG;
  }

  {
    StringPtr expected = "expected ";
    StringPtr codeArray = style == LOG ? nullptr : StringPtr(code);
    StringPtr sep = " = ";
    StringPtr delim = "; ";
    StringPtr colon = ": ";

    StringPtr sysErrorArray;
// On android before marshmallow only the posix version of stderror_r was
// available, even with __USE_GNU.
#if __USE_GNU && !(defined(__ANDROID_API__) && __ANDROID_API__ < 23)
    char buffer[256];
    if (style == SYSCALL) {
      if (sysErrorString == nullptr) {
        sysErrorArray = strerror_r(errorNumber, buffer, sizeof(buffer));
      } else {
        sysErrorArray = sysErrorString;
      }
    }
#else
    char buffer[256];
    if (style == SYSCALL) {
      if (sysErrorString == nullptr) {
        strerror_r(errorNumber, buffer, sizeof(buffer));
        sysErrorArray = buffer;
      } else {
        sysErrorArray = sysErrorString;
      }
    }
#endif

    size_t totalSize = 0;
    switch (style) {
      case LOG:
        break;
      case ASSERTION:
        totalSize += expected.size() + codeArray.size();
        break;
      case SYSCALL:
        totalSize += codeArray.size() + colon.size() + sysErrorArray.size();
        break;
    }

    for (size_t i = 0; i < argValues.size(); i++) {
      if (i > 0 || style != LOG) {
        totalSize += delim.size();
      }
      if (argNames[i].size() > 0 && argNames[i][0] != '\"') {
        totalSize += argNames[i].size() + sep.size();
      }
      totalSize += argValues[i].size();
    }

    String result = heapString(totalSize);
    char* pos = result.begin();

    switch (style) {
      case LOG:
        break;
      case ASSERTION:
        pos = _::fill(pos, expected, codeArray);
        break;
      case SYSCALL:
        pos = _::fill(pos, codeArray, colon, sysErrorArray);
        break;
    }

    for (size_t i = 0; i < argValues.size(); i++) {
      if (i > 0 || style != LOG) {
        pos = _::fill(pos, delim);
      }
      if (argNames[i].size() > 0 && argNames[i][0] != '\"') {
        pos = _::fill(pos, argNames[i], sep);
      }
      pos = _::fill(pos, argValues[i]);
    }

    return result;
  }
}